

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

function<void_(const_int_&)> * __thiscall
QtPromisePrivate::PromiseHandler<int,std::function<void(int_const&)>,int_const&>::
create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
          (function<void_(const_int_&)> *__return_storage_ptr__,
          PromiseHandler<int,std::function<void(int_const&)>,int_const&> *this,
          function<void_(const_int_&)> *handler,QPromiseResolve<void> *resolve,
          QPromiseReject<void> *reject)

{
  anon_class_48_3_a63a5800 local_58;
  QPromiseReject<void> *local_28;
  QPromiseReject<void> *reject_local;
  QPromiseResolve<void> *resolve_local;
  function<void_(const_int_&)> *handler_local;
  
  local_28 = (QPromiseReject<void> *)resolve;
  reject_local = (QPromiseReject<void> *)handler;
  resolve_local = (QPromiseResolve<void> *)this;
  handler_local = __return_storage_ptr__;
  QtPromise::QPromiseResolve<void>::QPromiseResolve
            (&local_58.resolve,(QPromiseResolve<void> *)handler);
  QtPromise::QPromiseReject<void>::QPromiseReject(&local_58.reject,local_28);
  std::function<void_(const_int_&)>::function
            (&local_58.handler,(function<void_(const_int_&)> *)resolve_local);
  std::function<void(int_const&)>::
  function<QtPromisePrivate::PromiseHandler<int,std::function<void(int_const&)>,int_const&>::create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(std::function<void(int_const&)>const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)::_lambda(int_const&)_1_,void>
            ((function<void(int_const&)> *)__return_storage_ptr__,&local_58);
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(std::function<void(int_const&)>const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda(int_const&)#1}::~create((_lambda_int_const___1_ *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

static std::function<void(const T&)>
    create(const THandler& handler, const TResolve& resolve, const TReject& reject)
    {
        return [=](const T& value) {
            PromiseDispatch<ResType>::call(resolve, reject, handler, value);
        };
    }